

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Int32 BZ2_indexIntoF(Int32 indx,Int32 *cftab)

{
  int iVar1;
  int iVar2;
  int local_20;
  Int32 mid;
  Int32 na;
  Int32 nb;
  Int32 *cftab_local;
  Int32 indx_local;
  
  mid = 0;
  local_20 = 0x100;
  do {
    iVar2 = mid + local_20 >> 1;
    iVar1 = iVar2;
    if (cftab[iVar2] <= indx) {
      iVar1 = local_20;
      mid = iVar2;
    }
    local_20 = iVar1;
  } while (local_20 - mid != 1);
  return mid;
}

Assistant:

__inline__ Int32 BZ2_indexIntoF ( Int32 indx, Int32 *cftab )
{
   Int32 nb, na, mid;
   nb = 0;
   na = 256;
   do {
      mid = (nb + na) >> 1;
      if (indx >= cftab[mid]) nb = mid; else na = mid;
   }
   while (na - nb != 1);
   return nb;
}